

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,ReturnStmt *node)

{
  Expr *pEVar1;
  ostream *poVar2;
  
  std::operator<<((ostream *)&std::cout,"return ");
  pEVar1 = (node->m_expr)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  (*(pEVar1->super_Stmt)._vptr_Stmt[2])(pEVar1,this);
  poVar2 = std::operator<<((ostream *)&std::cout,";");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::ReturnStmt *node) {
    std::cout << "return ";
    node->m_expr->accept(this);
    std::cout << ";" << std::endl;
}